

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall
Glucose::SimpSolver::merge
          (SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Glucose::Lit> *out_clause)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  Clause *pCVar8;
  undefined8 local_38;
  
  this->merges = this->merges + 1;
  if (out_clause->data != (Lit *)0x0) {
    out_clause->sz = 0;
  }
  lVar7 = *(long *)&_ps->header;
  lVar4 = *(long *)&_qs->header;
  pCVar8 = _qs;
  lVar5 = lVar7;
  if ((int)((ulong)lVar7 >> 0x20) < (int)((ulong)lVar4 >> 0x20)) {
    pCVar8 = _ps;
    _ps = _qs;
    lVar5 = lVar4;
    lVar4 = lVar7;
  }
  local_38 = in_RAX;
  if (0 < (int)((ulong)lVar4 >> 0x20)) {
    lVar7 = 0;
    do {
      uVar1 = *(uint *)(&pCVar8[1].header.field_0x0 + lVar7 * 4);
      if ((int)uVar1 >> 1 != v) {
        if (0 < (int)(*(ulong *)&_ps->header >> 0x20)) {
          uVar6 = 0;
          do {
            uVar2 = *(uint *)(&_ps[1].header.field_0x0 + uVar6 * 4);
            if ((int)uVar2 >> 1 == (int)uVar1 >> 1) {
              if ((uVar2 ^ uVar1) == 1) {
                return false;
              }
              goto LAB_0011864d;
            }
            uVar6 = uVar6 + 1;
          } while (*(ulong *)&_ps->header >> 0x20 != uVar6);
        }
        local_38 = CONCAT44(uVar1,local_38._0_4_);
        vec<Glucose::Lit>::push(out_clause,(Lit *)((long)&local_38 + 4));
        lVar4 = *(long *)&pCVar8->header;
      }
LAB_0011864d:
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar4 >> 0x20);
    lVar5 = *(long *)&_ps->header;
  }
  if (0 < (int)((ulong)lVar5 >> 0x20)) {
    lVar7 = 0;
    do {
      iVar3 = *(int *)(&_ps[1].header.field_0x0 + lVar7 * 4);
      if (iVar3 >> 1 != v) {
        local_38 = CONCAT44(local_38._4_4_,iVar3);
        vec<Glucose::Lit>::push(out_clause,(Lit *)&local_38);
        lVar5 = *(long *)&_ps->header;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar5 >> 0x20);
  }
  return true;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    for (int i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i]))
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (int i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}